

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void UpdateHistogramCost(VP8LHistogram *h)

{
  long *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint32_t *unaff_retaddr;
  int in_stack_0000000c;
  uint32_t *in_stack_00000010;
  int num_codes;
  double distance_cost;
  double alpha_cost;
  uint32_t blue_sym;
  uint32_t red_sym;
  uint32_t alpha_sym;
  uint local_14;
  uint local_10;
  uint local_c;
  
  dVar1 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar2 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar3 = (*VP8LExtraCost)((uint32_t *)(in_RDI + 0x181),0x28);
  VP8LHistogramNumCodes((int)in_RDI[0x195]);
  dVar4 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar5 = (*VP8LExtraCost)((uint32_t *)(*in_RDI + 0x400),0x18);
  in_RDI[0x197] = (long)(dVar4 + dVar5);
  dVar4 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  in_RDI[0x198] = (long)dVar4;
  dVar4 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  in_RDI[0x199] = (long)dVar4;
  in_RDI[0x196] =
       (long)((double)in_RDI[0x197] + (double)in_RDI[0x198] + (double)in_RDI[0x199] + dVar1 +
             dVar2 + dVar3);
  if ((local_c | local_10 | local_14) == 0xffffffff) {
    *(undefined4 *)((long)in_RDI + 0xcac) = 0xffffffff;
  }
  else {
    *(uint *)((long)in_RDI + 0xcac) = local_c << 0x18 | local_10 << 0x10 | local_14;
  }
  return;
}

Assistant:

static void UpdateHistogramCost(VP8LHistogram* const h) {
  uint32_t alpha_sym, red_sym, blue_sym;
  const double alpha_cost =
      PopulationCost(h->alpha_, NUM_LITERAL_CODES, &alpha_sym,
                     &h->is_used_[3]);
  const double distance_cost =
      PopulationCost(h->distance_, NUM_DISTANCE_CODES, NULL, &h->is_used_[4]) +
      VP8LExtraCost(h->distance_, NUM_DISTANCE_CODES);
  const int num_codes = VP8LHistogramNumCodes(h->palette_code_bits_);
  h->literal_cost_ =
      PopulationCost(h->literal_, num_codes, NULL, &h->is_used_[0]) +
          VP8LExtraCost(h->literal_ + NUM_LITERAL_CODES, NUM_LENGTH_CODES);
  h->red_cost_ =
      PopulationCost(h->red_, NUM_LITERAL_CODES, &red_sym, &h->is_used_[1]);
  h->blue_cost_ =
      PopulationCost(h->blue_, NUM_LITERAL_CODES, &blue_sym, &h->is_used_[2]);
  h->bit_cost_ = h->literal_cost_ + h->red_cost_ + h->blue_cost_ +
                 alpha_cost + distance_cost;
  if ((alpha_sym | red_sym | blue_sym) == VP8L_NON_TRIVIAL_SYM) {
    h->trivial_symbol_ = VP8L_NON_TRIVIAL_SYM;
  } else {
    h->trivial_symbol_ =
        ((uint32_t)alpha_sym << 24) | (red_sym << 16) | (blue_sym << 0);
  }
}